

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O2

void av1_cdef_mse_calc_block
               (CdefSearchCtx *cdef_search_ctx,aom_internal_error_info *error_info,int fbr,int fbc,
               int sb_count)

{
  uint64_t *puVar1;
  byte bVar2;
  byte bVar3;
  YV12_BUFFER_CONFIG *pYVar4;
  CommonModeInfoParams *mi_params;
  short sVar5;
  short sVar6;
  int iVar7;
  uint cdef_count;
  uint64_t uVar8;
  int64_t iVar9;
  BLOCK_SIZE bs;
  byte bVar10;
  int iVar11;
  uint16_t *puVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  uint8_t *puVar16;
  uint16_t x;
  uint uVar17;
  uint uVar18;
  int iVar19;
  ulong uVar20;
  int mi_row;
  int bw_log2;
  int iVar21;
  int mi_col;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int dirinit;
  int sec_strength;
  int pri_strength;
  int ref_stride [3];
  cdef_list dlist [1024];
  int var [16] [16];
  int dir [16] [16];
  uint16_t inbuf [19008];
  uint8_t tmp_dst8 [16384];
  int iStack_12614;
  int iStack_12604;
  uint8_t *puStack_12600;
  ulong uStack_125f8;
  int iStack_125ec;
  int iStack_125e8;
  int iStack_125e4;
  ulong uStack_125e0;
  ulong uStack_125d8;
  ulong uStack_125d0;
  CdefSearchCtx *pCStack_125c8;
  long lStack_125c0;
  long lStack_125b8;
  long lStack_125b0;
  int iStack_125a8;
  int iStack_125a4;
  int iStack_125a0;
  int iStack_1259c;
  int iStack_12598;
  int iStack_12594;
  uint uStack_12590;
  int iStack_1258c;
  int iStack_12588;
  int iStack_12584;
  CommonModeInfoParams *pCStack_12580;
  uint8_t *puStack_12578;
  ulong uStack_12570;
  int aiStack_12564 [3];
  macroblockd_plane *pmStack_12558;
  uint16_t *puStack_12550;
  ulong uStack_12548;
  ulong uStack_12540;
  ulong uStack_12538;
  ulong uStack_12530;
  BLOCK_SIZE (*paaBStack_12528) [2] [2];
  uint16_t *puStack_12520;
  long lStack_12518;
  BLOCK_SIZE *pBStack_12510;
  long lStack_12508;
  uint8_t *apuStack_12500 [4];
  cdef_list acStack_124e0 [1024];
  int aiStack_11ce0 [256];
  int aiStack_118e0 [256];
  uint16_t auStack_114e0 [8];
  uint16_t auStack_114d0 [280];
  uint16_t auStack_112a0 [8];
  uint16_t auStack_11290 [18712];
  uint16_t local_8060 [16408];
  
  puStack_12600 = (uint8_t *)CONCAT44(puStack_12600._4_4_,sb_count);
  pYVar4 = cdef_search_ctx->ref;
  mi_params = cdef_search_ctx->mi_params;
  uStack_125e0 = (ulong)(uint)cdef_search_ctx->coeff_shift;
  memset(aiStack_118e0,0,0x400);
  memset(aiStack_11ce0,0,0x400);
  mi_col = fbc * 0x10;
  iVar11 = mi_params->mi_cols + fbc * -0x10;
  iStack_12614 = 0x10;
  if (iVar11 < 0x10) {
    iStack_12614 = iVar11;
  }
  mi_row = fbr * 0x10;
  iVar7 = mi_params->mi_rows + fbr * -0x10;
  iStack_125e8 = 0x10;
  if (iVar7 < 0x10) {
    iStack_125e8 = iVar7;
  }
  apuStack_12500[0] = (pYVar4->field_5).field_0.y_buffer;
  apuStack_12500[1] = (pYVar4->field_5).field_0.u_buffer;
  apuStack_12500[2] = (pYVar4->field_5).field_0.v_buffer;
  aiStack_12564[0] = (pYVar4->field_4).field_0.y_stride;
  aiStack_12564[1] = (pYVar4->field_4).field_0.uv_stride;
  bs = mi_params->mi_grid_base[mi_params->mi_stride * mi_row + mi_col]->bsize;
  if ((byte)(bs - BLOCK_64X128) < 3) {
    if ((~bs & 0xe) == 0) {
      iStack_12614 = iVar11;
      if (0x1f < iVar11) {
        iStack_12614 = 0x20;
      }
      iVar11 = 2;
      if ((~bs & 0xd) != 0) {
        iVar7 = 1;
        goto LAB_001de427;
      }
    }
    else {
      iVar11 = 1;
    }
    iStack_125e8 = 0x20;
    if (iVar7 < 0x20) {
      iStack_125e8 = iVar7;
    }
    iVar7 = 2;
  }
  else {
    bs = BLOCK_64X64;
    iVar11 = 1;
    iVar7 = iVar11;
  }
LAB_001de427:
  iStack_125ec = fbr;
  pCStack_12580 = mi_params;
  aiStack_12564[2] = aiStack_12564[1];
  cdef_count = av1_cdef_compute_sb_list(mi_params,mi_row,mi_col,acStack_124e0,bs);
  iStack_1259c = iVar11 + fbc;
  iStack_125a4 = cdef_search_ctx->nvfb;
  iStack_125a8 = cdef_search_ctx->nhfb;
  bVar22 = iStack_1259c == iStack_125a8;
  iStack_125a0 = iVar7 + iStack_125ec;
  bVar23 = iStack_125a0 == iStack_125a4;
  bVar24 = iStack_125ec == 0;
  iVar11 = -0x120;
  if (bVar24) {
    iVar11 = 0;
  }
  uStack_12538 = (ulong)((uint)!bVar24 * 2);
  uVar18 = (uint)(fbc != 0);
  uVar17 = uVar18 * 8;
  uStack_12530 = (ulong)uVar17;
  uStack_12540 = (ulong)((uint)!bVar24 * 2 + (uint)!bVar23 * 2);
  uStack_12548 = (ulong)(uVar17 + (uint)!bVar22 * 8);
  iStack_12604 = 0;
  puStack_12550 = auStack_11290 + (int)(iVar11 + uVar18 * -8);
  lStack_125c0 = (long)(int)puStack_12600;
  paaBStack_12528 = av1_ss_size_lookup + bs;
  pmStack_12558 = cdef_search_ctx->plane;
  uVar20 = 0;
  pCStack_125c8 = cdef_search_ctx;
  do {
    if ((long)cdef_search_ctx->num_planes <= (long)uVar20) {
      cdef_search_ctx->sb_index[lStack_125c0] = mi_row * pCStack_12580->mi_stride + mi_col;
      return;
    }
    bVar10 = (byte)cdef_search_ctx->mi_wide_l2[uVar20];
    iVar21 = iStack_12614 << (bVar10 & 0x1f);
    bVar2 = (byte)cdef_search_ctx->mi_high_l2[uVar20];
    iVar15 = iStack_125e8 << (bVar2 & 0x1f);
    uVar18 = mi_row << (bVar2 & 0x1f);
    uStack_125d0 = (ulong)uVar18;
    uVar17 = mi_col << (bVar10 & 0x1f);
    uStack_125d8 = (ulong)uVar17;
    lStack_125b0 = (long)pmStack_12558[uVar20].subsampling_x;
    lStack_125b8 = (long)pmStack_12558[uVar20].subsampling_y;
    puStack_12578 = pmStack_12558[uVar20].dst.buf;
    iVar11 = pmStack_12558[uVar20].dst.stride;
    iVar7 = uVar18 - (int)uStack_12538;
    iVar19 = uVar17 - (int)uStack_12530;
    x = (uint16_t)iVar19;
    (*cdef_search_ctx->copy_fn)
              (puStack_12550,0x90,puStack_12578,iVar7,iVar19,iVar11,(int)uStack_12540 + iVar15,
               (int)uStack_12548 + iVar21);
    if (((fbc == 0 || bVar24) || bVar22) || bVar23) {
      if (iStack_125a0 == iStack_125a4) {
        fill_rect(auStack_114e0 + (iVar15 * 0x90 + 0x128),2,iVar21,iVar7,x);
LAB_001de6a1:
        fill_rect(auStack_114e0 + (iVar15 * 0x90 + 0x120),2,8,iVar7,x);
        cdef_search_ctx = pCStack_125c8;
      }
      else if (fbc == 0) goto LAB_001de6a1;
      if (bVar23 || bVar22) {
        puVar12 = auStack_114d0;
        fill_rect(puVar12 + (iVar15 * 0x90 + iVar21 + 0x120),2,8,(int)puVar12,x);
        iVar7 = (int)puVar12;
      }
      if (iStack_125ec == 0) {
        fill_rect(auStack_114d0,2,iVar21,iVar7,x);
LAB_001de717:
        fill_rect(auStack_114e0,2,8,iVar7,x);
      }
      else if (fbc == 0) goto LAB_001de717;
      if (bVar24 || bVar22) {
        fill_rect(auStack_114d0 + iVar21,2,8,iVar7,x);
      }
      if (fbc == 0) {
        fill_rect(auStack_112a0,iVar15,8,iVar7,x);
      }
      if (iStack_1259c == iStack_125a8) {
        fill_rect(auStack_11290 + iVar21,iVar15,8,iVar7,x);
      }
    }
    iVar7 = 3 - (int)lStack_125b0;
    uVar17 = 3 - (int)lStack_125b8;
    uStack_12570 = (ulong)uVar17;
    pBStack_12510 = (*paaBStack_12528)[lStack_125b0] + lStack_125b8;
    iStack_1258c = uVar17 + iVar7;
    iStack_125e4 = 1 << ((byte)uVar17 & 0x1f);
    iStack_12594 = (int)(short)uStack_125d0;
    iStack_12598 = (int)(short)uStack_125d8;
    puStack_12520 = (uint16_t *)(puStack_12578 + (iVar11 * iStack_12594 + iStack_12598));
    lVar13 = 0;
    uStack_125f8 = uVar20;
    while (lVar13 < cdef_search_ctx->total_strengths) {
      lStack_12508 = lVar13;
      get_cdef_filter_strengths
                (cdef_search_ctx->pick_method,&iStack_12584,&iStack_12588,(int)lVar13);
      puStack_12600 = apuStack_12500[uVar20];
      iVar15 = aiStack_12564[uVar20];
      iVar19 = (int)uStack_125e0;
      if (cdef_search_ctx->use_highbitdepth == false) {
        bVar10 = block_size_wide[*pBStack_12510];
        uVar17 = (uint)block_size_high[*pBStack_12510];
        if (uVar17 * bVar10 >> ((byte)iStack_1258c & 0x1f) == cdef_count) {
          lVar13 = (long)(iVar15 * iStack_12594 + iStack_12598);
          if (iStack_12588 == 0 && iStack_12584 == 0) {
            puVar16 = puStack_12600 + lVar13;
            puVar12 = puStack_12520;
            iVar19 = iVar11;
          }
          else {
            iVar21 = iStack_12588;
            if (iStack_12588 == 3) {
              iVar21 = 4;
            }
            uStack_12590 = (uint)block_size_high[*pBStack_12510];
            lStack_12518 = lVar13;
            av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                               cdef_search_ctx->xdec[uVar20],cdef_search_ctx->ydec[uVar20],
                               (int (*) [16])aiStack_118e0,&iStack_12604,(int (*) [16])aiStack_11ce0
                               ,(int)uVar20,acStack_124e0,cdef_count,iStack_12584,iVar21,
                               cdef_search_ctx->damping,iVar19);
            puVar16 = puStack_12600 + lStack_12518;
            puVar12 = local_8060;
            uVar17 = uStack_12590;
            iVar19 = 0x80;
          }
          uVar8 = (*aom_sse)(puVar16,iVar15,(uint8_t *)puVar12,iVar19,(uint)bVar10,uVar17);
        }
        else {
          bVar10 = (byte)iVar7;
          if (iStack_12588 == 0 && iStack_12584 == 0) {
            uVar8 = 0;
            for (uVar17 = 0; uVar20 = uStack_125f8, cdef_search_ctx = pCStack_125c8,
                (int)uVar17 < (int)cdef_count; uVar17 = uVar17 + iVar19) {
              bVar2 = acStack_124e0[uVar17].by;
              bVar3 = acStack_124e0[uVar17].bx;
              iVar19 = 1;
              if ((((int)lStack_125b0 == (int)lStack_125b8) &&
                  (((uVar18 = uVar17 + 3, (int)cdef_count <= (int)uVar18 ||
                    (bVar2 != acStack_124e0[uVar18].by)) ||
                   (iVar19 = 4, bVar3 + 3 != (uint)acStack_124e0[uVar18].bx)))) &&
                 (((uVar18 = uVar17 + 1, (int)cdef_count <= (int)uVar18 ||
                   (bVar2 != acStack_124e0[uVar18].by)) ||
                  (iVar19 = 2, bVar3 + 1 != (uint)acStack_124e0[uVar18].bx)))) {
                iVar19 = 1;
              }
              iVar21 = (int)(short)(((ushort)bVar2 << ((byte)uStack_12570 & 0x1f)) +
                                   (short)uStack_125d0);
              iVar14 = (int)(short)(((ushort)bVar3 << (bVar10 & 0x1f)) + (short)uStack_125d8);
              iVar9 = (*aom_sse)(puStack_12600 + (iVar21 * iVar15 + iVar14),iVar15,
                                 puStack_12578 + (iVar21 * iVar11 + iVar14),iVar11,
                                 iVar19 << (bVar10 & 0x1f),iStack_125e4);
              uVar8 = uVar8 + iVar9;
            }
          }
          else {
            iVar21 = iStack_12588;
            if (iStack_12588 == 3) {
              iVar21 = 4;
            }
            av1_cdef_filter_fb((uint8_t *)local_8060,(uint16_t *)0x0,0x80,auStack_11290,
                               cdef_search_ctx->xdec[uVar20],cdef_search_ctx->ydec[uVar20],
                               (int (*) [16])aiStack_118e0,&iStack_12604,(int (*) [16])aiStack_11ce0
                               ,(int)uVar20,acStack_124e0,cdef_count,iStack_12584,iVar21,
                               cdef_search_ctx->damping,iVar19);
            uVar8 = 0;
            for (uVar17 = 0; uVar20 = uStack_125f8, cdef_search_ctx = pCStack_125c8,
                (int)uVar17 < (int)cdef_count; uVar17 = uVar17 + iVar19) {
              bVar2 = acStack_124e0[uVar17].by;
              bVar3 = acStack_124e0[uVar17].bx;
              sVar5 = (ushort)bVar2 << ((byte)uStack_12570 & 0x1f);
              sVar6 = (ushort)bVar3 << (bVar10 & 0x1f);
              iVar19 = 1;
              if (((int)lStack_125b0 == (int)lStack_125b8) &&
                 ((((uVar18 = uVar17 + 3, (int)cdef_count <= (int)uVar18 ||
                    (bVar2 != acStack_124e0[uVar18].by)) ||
                   (iVar19 = 4, bVar3 + 3 != (uint)acStack_124e0[uVar18].bx)) &&
                  (((uVar18 = uVar17 + 1, (int)cdef_count <= (int)uVar18 ||
                    (bVar2 != acStack_124e0[uVar18].by)) ||
                   (iVar19 = 2, bVar3 + 1 != (uint)acStack_124e0[uVar18].bx)))))) {
                iVar19 = 1;
              }
              iVar9 = (*aom_sse)(puStack_12600 +
                                 ((int)(short)((short)uStack_125d8 + sVar6) +
                                 (short)((short)uStack_125d0 + sVar5) * iVar15),iVar15,
                                 (uint8_t *)((long)local_8060 + (long)((int)sVar6 + sVar5 * 0x80)),
                                 0x80,iVar19 << (bVar10 & 0x1f),iStack_125e4);
              uVar8 = uVar8 + iVar9;
            }
          }
        }
      }
      else {
        iVar21 = iStack_12588;
        if (iStack_12588 == 3) {
          iVar21 = 4;
        }
        av1_cdef_filter_fb((uint8_t *)0x0,local_8060,0x90,auStack_11290,
                           cdef_search_ctx->xdec[uVar20],cdef_search_ctx->ydec[uVar20],
                           (int (*) [16])aiStack_118e0,&iStack_12604,(int (*) [16])aiStack_11ce0,
                           (int)uStack_125f8,acStack_124e0,cdef_count,iStack_12584,iVar21,
                           cdef_search_ctx->damping,iVar19);
        uVar20 = uStack_125f8;
        uVar8 = (*cdef_search_ctx->compute_cdef_dist_fn)
                          (puStack_12600,iVar15,local_8060,acStack_124e0,cdef_count,
                           (BLOCK_SIZE)cdef_search_ctx->bsize[uStack_125f8],(int)uStack_125e0,
                           (int)uStack_125d0,(int)uStack_125d8);
      }
      if (uVar20 < 2) {
        cdef_search_ctx->mse[uVar20][lStack_125c0][lStack_12508] = uVar8;
      }
      else {
        puVar1 = cdef_search_ctx->mse[1][lStack_125c0] + lStack_12508;
        *puVar1 = *puVar1 + uVar8;
      }
      lVar13 = lStack_12508 + 1;
    }
    uVar20 = uVar20 + 1;
  } while( true );
}

Assistant:

void av1_cdef_mse_calc_block(CdefSearchCtx *cdef_search_ctx,
                             struct aom_internal_error_info *error_info,
                             int fbr, int fbc, int sb_count) {
  // TODO(aomedia:3276): Pass error_info to the low-level functions as required
  // in future to handle error propagation.
  (void)error_info;
  const CommonModeInfoParams *const mi_params = cdef_search_ctx->mi_params;
  const YV12_BUFFER_CONFIG *ref = cdef_search_ctx->ref;
  const int coeff_shift = cdef_search_ctx->coeff_shift;
  const int *mi_wide_l2 = cdef_search_ctx->mi_wide_l2;
  const int *mi_high_l2 = cdef_search_ctx->mi_high_l2;

  // Declare and initialize the temporary buffers.
  DECLARE_ALIGNED(32, uint16_t, inbuf[CDEF_INBUF_SIZE]);
  cdef_list dlist[MI_SIZE_128X128 * MI_SIZE_128X128];
  int dir[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  int var[CDEF_NBLOCKS][CDEF_NBLOCKS] = { { 0 } };
  uint16_t *const in = inbuf + CDEF_VBORDER * CDEF_BSTRIDE + CDEF_HBORDER;
  int nhb = AOMMIN(MI_SIZE_64X64, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
  int nvb = AOMMIN(MI_SIZE_64X64, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
  int hb_step = 1, vb_step = 1;
  BLOCK_SIZE bs;

  const MB_MODE_INFO *const mbmi =
      mi_params->mi_grid_base[MI_SIZE_64X64 * fbr * mi_params->mi_stride +
                              MI_SIZE_64X64 * fbc];

  uint8_t *ref_buffer[MAX_MB_PLANE] = { ref->y_buffer, ref->u_buffer,
                                        ref->v_buffer };
  int ref_stride[MAX_MB_PLANE] = { ref->y_stride, ref->uv_stride,
                                   ref->uv_stride };

  if (mbmi->bsize == BLOCK_128X128 || mbmi->bsize == BLOCK_128X64 ||
      mbmi->bsize == BLOCK_64X128) {
    bs = mbmi->bsize;
    if (bs == BLOCK_128X128 || bs == BLOCK_128X64) {
      nhb = AOMMIN(MI_SIZE_128X128, mi_params->mi_cols - MI_SIZE_64X64 * fbc);
      hb_step = 2;
    }
    if (bs == BLOCK_128X128 || bs == BLOCK_64X128) {
      nvb = AOMMIN(MI_SIZE_128X128, mi_params->mi_rows - MI_SIZE_64X64 * fbr);
      vb_step = 2;
    }
  } else {
    bs = BLOCK_64X64;
  }
  // Get number of 8x8 blocks which are not skip. Cdef processing happens for
  // 8x8 blocks which are not skip.
  const int cdef_count = av1_cdef_compute_sb_list(
      mi_params, fbr * MI_SIZE_64X64, fbc * MI_SIZE_64X64, dlist, bs);
  const bool is_fb_on_frm_left_boundary = (fbc == 0);
  const bool is_fb_on_frm_right_boundary =
      (fbc + hb_step == cdef_search_ctx->nhfb);
  const bool is_fb_on_frm_top_boundary = (fbr == 0);
  const bool is_fb_on_frm_bottom_boundary =
      (fbr + vb_step == cdef_search_ctx->nvfb);
  const int yoff = CDEF_VBORDER * (!is_fb_on_frm_top_boundary);
  const int xoff = CDEF_HBORDER * (!is_fb_on_frm_left_boundary);
  int dirinit = 0;
  for (int pli = 0; pli < cdef_search_ctx->num_planes; pli++) {
    /* We avoid filtering the pixels for which some of the pixels to
    average are outside the frame. We could change the filter instead,
    but it would add special cases for any future vectorization. */
    const int hfilt_size = (nhb << mi_wide_l2[pli]);
    const int vfilt_size = (nvb << mi_high_l2[pli]);
    const int ysize =
        vfilt_size + CDEF_VBORDER * (!is_fb_on_frm_bottom_boundary) + yoff;
    const int xsize =
        hfilt_size + CDEF_HBORDER * (!is_fb_on_frm_right_boundary) + xoff;
    const int row = fbr * MI_SIZE_64X64 << mi_high_l2[pli];
    const int col = fbc * MI_SIZE_64X64 << mi_wide_l2[pli];
    struct macroblockd_plane pd = cdef_search_ctx->plane[pli];
    cdef_search_ctx->copy_fn(&in[(-yoff * CDEF_BSTRIDE - xoff)], CDEF_BSTRIDE,
                             pd.dst.buf, row - yoff, col - xoff, pd.dst.stride,
                             ysize, xsize);
    fill_borders_for_fbs_on_frame_boundary(
        inbuf, hfilt_size, vfilt_size, is_fb_on_frm_left_boundary,
        is_fb_on_frm_right_boundary, is_fb_on_frm_top_boundary,
        is_fb_on_frm_bottom_boundary);
    for (int gi = 0; gi < cdef_search_ctx->total_strengths; gi++) {
      int pri_strength, sec_strength;
      get_cdef_filter_strengths(cdef_search_ctx->pick_method, &pri_strength,
                                &sec_strength, gi);
      const uint64_t curr_mse = get_filt_error(
          cdef_search_ctx, &pd, dlist, dir, &dirinit, var, in, ref_buffer[pli],
          ref_stride[pli], row, col, pri_strength, sec_strength, cdef_count,
          pli, coeff_shift, bs);
      if (pli < 2)
        cdef_search_ctx->mse[pli][sb_count][gi] = curr_mse;
      else
        cdef_search_ctx->mse[1][sb_count][gi] += curr_mse;
    }
  }
  cdef_search_ctx->sb_index[sb_count] =
      MI_SIZE_64X64 * fbr * mi_params->mi_stride + MI_SIZE_64X64 * fbc;
}